

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O0

void compute_response_layer_Dxx_top(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int *in_RSI;
  int *in_RDI;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  int j_5;
  int i_3;
  int j_4;
  int j_3;
  int i_2;
  int j_2;
  int i_1;
  int j_1;
  int j;
  int i;
  int iwidth;
  int iheight;
  float *data;
  int ind;
  float inv_area;
  int border;
  int lobe;
  int width;
  int height;
  int filter_size;
  int step;
  int data_width;
  bool *laplacian;
  float *response;
  int k0;
  int k;
  float D;
  float C;
  float B;
  float A;
  float Dxx1;
  float Dxx0;
  int c11;
  int c10;
  int r11;
  int r10;
  int c01;
  int c00;
  int r01;
  int r00;
  int c1;
  int c0;
  int r1;
  int r0;
  int y;
  int x;
  float Dxy;
  float Dyy;
  float Dxx;
  float in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  float in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_ac;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  
  lVar7 = *(long *)(in_RDI + 4);
  lVar8 = *(long *)(in_RDI + 6);
  iVar2 = in_RSI[4];
  iVar3 = in_RDI[3];
  iVar4 = *in_RDI;
  iVar5 = in_RDI[2];
  iVar6 = in_RDI[1];
  iVar13 = iVar4 / 3;
  uVar14 = (iVar4 + -1) / 2;
  fVar18 = 1.0 / (float)(iVar4 * iVar4);
  lVar9 = *(long *)(in_RSI + 2);
  iVar4 = *in_RSI;
  for (local_c4 = 0; local_c4 < iVar13; local_c4 = iVar3 + local_c4) {
    local_ac = (local_c4 / iVar3) * iVar6;
    for (local_c8 = 0; local_cc = ((iVar13 / 2 + iVar3) / iVar3) * iVar3, local_c8 < iVar13 / 2 + 1;
        local_c8 = iVar3 + local_c8) {
      in_stack_ffffffffffffff04 = 0xc0400000;
      auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416(*(uint *)(lVar9 + (long)((local_c4 + -1 + iVar13) * iVar2 +
                                                                ~(iVar13 / 2) + local_c8 + iVar13) *
                                                          4)),
                                ZEXT416(*(uint *)(lVar9 + (long)(int)((local_c4 + -1 + iVar13) *
                                                                      iVar2 + local_c8 + uVar14) * 4
                                                 )));
      iVar16 = local_c8;
      in_stack_ffffffffffffff00 =
           box_integral((integral_image *)CONCAT44(local_c8,in_stack_ffffffffffffff10),
                        (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,-0x3fc00000,
                        (int)in_stack_ffffffffffffff00);
      auVar24._0_4_ =
           box_integral((integral_image *)CONCAT44(iVar16,in_stack_ffffffffffffff10),
                        (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      auVar24._4_60_ = extraout_var;
      auVar12 = vfmadd213ss_fma(ZEXT416(in_stack_ffffffffffffff04),auVar24._0_16_,
                                ZEXT416((uint)in_stack_ffffffffffffff00));
      in_stack_ffffffffffffff08 =
           box_integral((integral_image *)CONCAT44(iVar16,in_stack_ffffffffffffff10),
                        (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar19 = box_integral((integral_image *)CONCAT44(iVar16,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      in_stack_ffffffffffffff0c = in_stack_ffffffffffffff08 + fVar19;
      fVar19 = box_integral((integral_image *)CONCAT44(iVar16,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      in_stack_ffffffffffffff10 = in_stack_ffffffffffffff0c - fVar19;
      fVar20 = box_integral((integral_image *)CONCAT44(iVar16,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar19 = auVar11._0_4_ * fVar18;
      fVar10 = auVar12._0_4_ * fVar18;
      fVar20 = (in_stack_ffffffffffffff10 - fVar20) * fVar18;
      auVar11 = vfmsub213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar19),
                                ZEXT416((uint)(fVar20 * 0.81 * fVar20)));
      *(int *)(lVar7 + (long)local_ac * 4) = auVar11._0_4_;
      *(byte *)(lVar8 + local_ac) = (fVar19 + fVar10 < 0.0) - 1U & 1;
      local_ac = local_ac + 1;
    }
    for (; local_cc < (int)(uVar14 + 1); local_cc = iVar3 + local_cc) {
      iVar16 = local_c4 + -1 + iVar13;
      iVar15 = ~(iVar13 / 2) + local_cc;
      auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416((uint)(*(float *)(lVar9 + (long)(iVar16 * iVar2 +
                                                                        iVar15 + iVar13) * 4) -
                                              *(float *)(lVar9 + (long)(iVar16 * iVar2 + iVar15) * 4
                                                        ))),
                                ZEXT416(*(uint *)(lVar9 + (long)(int)((local_c4 + -1 + iVar13) *
                                                                      iVar2 + local_cc + uVar14) * 4
                                                 )));
      fVar19 = box_integral((integral_image *)CONCAT44(local_c8,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      auVar25._0_4_ =
           box_integral((integral_image *)CONCAT44(local_c8,in_stack_ffffffffffffff10),
                        (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      auVar25._4_60_ = extraout_var_00;
      auVar12 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar25._0_16_,ZEXT416((uint)fVar19));
      fVar20 = box_integral((integral_image *)CONCAT44(local_c8,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar21 = box_integral((integral_image *)CONCAT44(local_c8,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar22 = box_integral((integral_image *)CONCAT44(local_c8,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar23 = box_integral((integral_image *)CONCAT44(local_c8,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar19 = auVar11._0_4_ * fVar18;
      fVar10 = auVar12._0_4_ * fVar18;
      fVar20 = (((fVar20 + fVar21) - fVar22) - fVar23) * fVar18;
      auVar11 = vfmsub213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar19),
                                ZEXT416((uint)(fVar20 * 0.81 * fVar20)));
      *(int *)(lVar7 + (long)local_ac * 4) = auVar11._0_4_;
      *(byte *)(lVar8 + local_ac) = (fVar19 + fVar10 < 0.0) - 1U & 1;
      local_ac = local_ac + 1;
    }
    in_stack_ffffffffffffff14 = local_c8;
  }
  iVar16 = ((int)(uVar14 + iVar3) / iVar3) * iVar3;
  for (local_d0 = 0; local_d0 < iVar13; local_d0 = iVar3 + local_d0) {
    local_ac = (local_d0 / iVar3) * iVar6 + iVar16 / iVar3;
    for (local_d4 = iVar16; local_d4 < (int)(iVar6 * iVar3 - uVar14); local_d4 = iVar3 + local_d4) {
      iVar15 = local_d0 + -1 + iVar13;
      iVar1 = local_d0 + -1 + iVar13;
      iVar17 = ~(iVar13 / 2) + local_d4;
      auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416((uint)(*(float *)(lVar9 + (long)(iVar1 * iVar2 +
                                                                        iVar17 + iVar13) * 4) -
                                              *(float *)(lVar9 + (long)(iVar1 * iVar2 + iVar17) * 4)
                                              )),
                                ZEXT416((uint)(*(float *)(lVar9 + (long)(int)(iVar15 * iVar2 +
                                                                             local_d4 + uVar14) * 4)
                                              - *(float *)(lVar9 + (long)(int)(iVar15 * iVar2 +
                                                                              ~uVar14 + local_d4) *
                                                                   4))));
      fVar19 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      auVar26._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      auVar26._4_60_ = extraout_var_01;
      auVar12 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar26._0_16_,ZEXT416((uint)fVar19));
      fVar20 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar21 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar22 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar23 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar19 = auVar11._0_4_ * fVar18;
      fVar10 = auVar12._0_4_ * fVar18;
      fVar20 = (((fVar20 + fVar21) - fVar22) - fVar23) * fVar18;
      auVar11 = vfmsub213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar19),
                                ZEXT416((uint)(fVar20 * 0.81 * fVar20)));
      *(int *)(lVar7 + (long)local_ac * 4) = auVar11._0_4_;
      *(byte *)(lVar8 + local_ac) = (fVar19 + fVar10 < 0.0) - 1U & 1;
      local_ac = local_ac + 1;
    }
  }
  iVar16 = ((int)((iVar6 * iVar3 - uVar14) + iVar3 + -1) / iVar3) * iVar3;
  for (local_d8 = 0; local_d8 < iVar13; local_d8 = iVar3 + local_d8) {
    local_ac = (local_d8 / iVar3) * iVar6 + iVar16 / iVar3;
    for (local_dc = iVar16; local_e0 = (((iVar6 * iVar3 - iVar13 / 2) + iVar3 + -1) / iVar3) * iVar3
        , local_dc < iVar6 * iVar3 - iVar13 / 2; local_dc = iVar3 + local_dc) {
      iVar15 = local_d8 + -1 + iVar13;
      iVar1 = local_d8 + -1 + iVar13;
      iVar17 = ~(iVar13 / 2) + local_dc;
      auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416((uint)(*(float *)(lVar9 + (long)(iVar1 * iVar2 +
                                                                        iVar17 + iVar13) * 4) -
                                              *(float *)(lVar9 + (long)(iVar1 * iVar2 + iVar17) * 4)
                                              )),
                                ZEXT416((uint)(*(float *)(lVar9 + (long)(iVar15 * iVar2 + -1 + iVar4
                                                                        ) * 4) -
                                              *(float *)(lVar9 + (long)(int)(iVar15 * iVar2 +
                                                                            ~uVar14 + local_dc) * 4)
                                              )));
      fVar19 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      auVar27._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      auVar27._4_60_ = extraout_var_02;
      auVar12 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar27._0_16_,ZEXT416((uint)fVar19));
      fVar20 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar21 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar22 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar23 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar19 = auVar11._0_4_ * fVar18;
      fVar10 = auVar12._0_4_ * fVar18;
      fVar20 = (((fVar20 + fVar21) - fVar22) - fVar23) * fVar18;
      auVar11 = vfmsub213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar19),
                                ZEXT416((uint)(fVar20 * 0.81 * fVar20)));
      *(int *)(lVar7 + (long)local_ac * 4) = auVar11._0_4_;
      *(byte *)(lVar8 + local_ac) = (fVar19 + fVar10 < 0.0) - 1U & 1;
      local_ac = local_ac + 1;
    }
    for (; local_e0 < iVar6 * iVar3; local_e0 = iVar3 + local_e0) {
      iVar15 = local_d8 + -1 + iVar13;
      iVar1 = local_d8 + -1 + iVar13;
      auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                                ZEXT416((uint)(*(float *)(lVar9 + (long)(iVar1 * iVar2 + -1 + iVar4)
                                                                  * 4) -
                                              *(float *)(lVar9 + (long)(iVar1 * iVar2 +
                                                                       ~(iVar13 / 2) + local_e0) * 4
                                                        ))),
                                ZEXT416((uint)(*(float *)(lVar9 + (long)(iVar15 * iVar2 + -1 + iVar4
                                                                        ) * 4) -
                                              *(float *)(lVar9 + (long)(int)(iVar15 * iVar2 +
                                                                            ~uVar14 + local_e0) * 4)
                                              )));
      fVar19 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      auVar28._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      auVar28._4_60_ = extraout_var_03;
      auVar12 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar28._0_16_,ZEXT416((uint)fVar19));
      fVar20 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar21 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar22 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar23 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar19 = auVar11._0_4_ * fVar18;
      fVar10 = auVar12._0_4_ * fVar18;
      fVar20 = (((fVar20 + fVar21) - fVar22) - fVar23) * fVar18;
      auVar11 = vfmsub213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar19),
                                ZEXT416((uint)(fVar20 * 0.81 * fVar20)));
      *(int *)(lVar7 + (long)local_ac * 4) = auVar11._0_4_;
      *(byte *)(lVar8 + local_ac) = (fVar19 + fVar10 < 0.0) - 1U & 1;
      local_ac = local_ac + 1;
    }
  }
  for (local_e4 = ((iVar13 + iVar3 + -1) / iVar3) * iVar3; local_e4 < iVar5 * iVar3;
      local_e4 = iVar3 + local_e4) {
    local_ac = (local_e4 / iVar3) * iVar6;
    for (local_e8 = 0; local_e8 < iVar6 * iVar3; local_e8 = iVar3 + local_e8) {
      fVar19 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      auVar29._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      auVar29._4_60_ = extraout_var_04;
      auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar29._0_16_,ZEXT416((uint)fVar19))
      ;
      fVar19 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      auVar30._0_4_ =
           box_integral((integral_image *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      auVar30._4_60_ = extraout_var_05;
      auVar12 = vfmadd213ss_fma(ZEXT416(0xc0400000),auVar30._0_16_,ZEXT416((uint)fVar19));
      fVar20 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar21 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar22 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar23 = box_integral((integral_image *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            (int)in_stack_ffffffffffffff0c,(int)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff04,(int)in_stack_ffffffffffffff00);
      fVar19 = auVar11._0_4_ * fVar18;
      fVar10 = auVar12._0_4_ * fVar18;
      fVar20 = (((fVar20 + fVar21) - fVar22) - fVar23) * fVar18;
      auVar11 = vfmsub213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar19),
                                ZEXT416((uint)(fVar20 * 0.81 * fVar20)));
      *(int *)(lVar7 + (long)local_ac * 4) = auVar11._0_4_;
      *(byte *)(lVar8 + local_ac) = (fVar19 + fVar10 < 0.0) - 1U & 1;
      local_ac = local_ac + 1;
    }
  }
  return;
}

Assistant:

void compute_response_layer_Dxx_top(struct response_layer *layer, struct integral_image *iimage) {
    /*
        base function: compute_response_layer_Dxx_leftcorner

        optimization:
        - Dxx box filter hand optimized and split into cases (here only top)
    */
    float Dxx, Dyy, Dxy;
    int x, y;
    int r0, r1, c0, c1, r00, r01, c00, c01, r10, r11, c10, c11;
    float Dxx0, Dxx1;
    float A, B, C, D;
    int k, k0;

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int data_width = iimage->data_width;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size / 3;
    int border = (filter_size - 1) / 2;
    float inv_area = 1.f / (filter_size * filter_size);

    int ind = 0;  // oder alternativ (i+1)*j

    float *data = (float *) iimage->data;  // brauch hier keinen cast weil es eig float sein sollte
    int iheight = iimage->height;
    int iwidth = iimage->width;

    /*
        In our optimized function, i and j are raw coordinates in the integral
        / original image. In the original function these coordinates are
        coordinates of the layer. We changed it this way in the optimized function
        because its easier to about corner cases in raw coordinates.
    */

    k = (lobe / 2 + 1 + step - 1) / step * step;

    // Top Left Corner
    for (int i = 0; i < lobe; i += step) {
        ind = (i / step) * width;

        // Case 1: C of neg part outside
        for (int j = 0; j < lobe / 2 + 1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy  
            // whole box filter
            r01 = x + lobe - 1;
            c01 = y + border;

            Dxx0 = data[r01 * data_width + c01];

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe; // -1 is already part of r10

            D = data[r11 * data_width + c11];
            Dxx1 = D;

            Dxx = Dxx0 - 3 * Dxx1;

            // Compute Dxx, Dxy
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }

        // Case 2: B of neg part inside
        // initial value has to be rounded up to next bigger step
        for (int j = k; j < border + 1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c01 = y + border;

            Dxx0 = data[r01 * data_width + c01];

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe; // -1 is already part of r10

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Compute Dxx, Dxy
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Mid
    k = (border + 1 + step - 1) / step * step;

    for (int i = 0; i < lobe; i += step) {
        ind = (i / step) * width + (k / step);

        for (int j = k; j < width * step - border; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c00 = y - border - 1;
            c01 = y + border;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + c01];

            Dxx0 = D - C;

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe; // -1 is already part of r10

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) -
                  box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Right
    k = (width * step - border + step - 1) / step * step;
    k0 = (width * step - lobe / 2 + step - 1) / step * step;

    for (int i = 0; i < lobe; i += step) {
        ind = (i / step) * width + (k / step);

        // Case 1: D of neg part inside
        for (int j = k; j < width * step - lobe / 2; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c00 = y - border - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];

            Dxx0 = D - C;

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;
            c11 = c10 + lobe;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }

        // Case 2: D of neg part outside
        for (int j = k0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dxx 
            // whole box filter
            r01 = x + lobe - 1;
            c00 = y - border - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];

            Dxx0 = D - C;

            // neg part box filter
            r11 = x + lobe - 1;
            c10 = y - lobe / 2 - 1;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + iwidth-1];
            Dxx1 = D - C;

            Dxx = Dxx0 - 3 * Dxx1;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Rest
    k = (lobe + step - 1) / step * step;

    for (int i = k; i < height * step; i += step) {
        ind = (i / step) * width;

        for (int j = 0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }
}